

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_partitioned.c
# Opt level: O0

N_Vector exact_sol(N_Vector y0,sunrealtype tf,UserData *user_data)

{
  double dVar1;
  double dVar2;
  N_Vector p_Var3;
  double *pdVar4;
  double *in_RSI;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  sunrealtype lambda;
  sunrealtype y0_val;
  N_Vector sol;
  
  p_Var3 = (N_Vector)N_VClone(in_RDI);
  pdVar4 = (double *)N_VGetArrayPointer(in_RDI);
  dVar1 = *pdVar4;
  dVar2 = *in_RSI;
  dVar5 = exp(dVar2 * in_XMM0_Qa);
  pdVar4 = (double *)N_VGetArrayPointer(p_Var3);
  *pdVar4 = (dVar2 * dVar1) / (-(dVar1 - dVar2) * dVar5 + dVar1);
  return p_Var3;
}

Assistant:

static N_Vector exact_sol(N_Vector y0, sunrealtype tf, UserData* user_data)
{
  N_Vector sol       = N_VClone(y0);
  sunrealtype y0_val = N_VGetArrayPointer(y0)[0];
  sunrealtype lambda = user_data->lambda;
  N_VGetArrayPointer(sol)[0] =
    lambda * y0_val / (y0_val - (y0_val - lambda) * SUNRexp(lambda * tf));
  return sol;
}